

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void windowAggFinal(WindowCodeArg *p,int bFin)

{
  Window *pWVar1;
  ExprList *pEVar2;
  FuncDef *pFVar3;
  Window *pWVar4;
  Vdbe *p_00;
  int iVar5;
  Op *pOVar6;
  
  pWVar1 = p->pMWin;
  p_00 = sqlite3GetVdbe(p->pParse);
  for (pWVar4 = pWVar1; pWVar4 != (Window *)0x0; pWVar4 = pWVar4->pNextWin) {
    if (((pWVar1->regStartRowid == 0) && ((pWVar4->pWFunc->funcFlags & 0x1000) != 0)) &&
       (pWVar4->eStart != '[')) {
      sqlite3VdbeAddOp3(p_00,0x4b,0,pWVar4->regResult,0);
      sqlite3VdbeAddOp3(p_00,0x20,pWVar4->csrApp,0,0);
      sqlite3VdbeAddOp3(p_00,0x5e,pWVar4->csrApp,0,pWVar4->regResult);
      pOVar6 = (Op *)&sqlite3VdbeGetOp_dummy;
      if (p_00->db->mallocFailed == '\0') {
        pOVar6 = p_00->aOp + (long)p_00->nOp + -2;
      }
      pOVar6->p2 = p_00->nOp;
    }
    else if (pWVar4->regApp == 0) {
      pEVar2 = (pWVar4->pOwner->x).pList;
      if (pEVar2 == (ExprList *)0x0) {
        iVar5 = 0;
      }
      else {
        iVar5 = pEVar2->nExpr;
      }
      if (bFin == 0) {
        sqlite3VdbeAddOp3(p_00,0xa4,pWVar4->regAccum,iVar5,pWVar4->regResult);
        pFVar3 = pWVar4->pWFunc;
        if (p_00->db->mallocFailed == '\0') {
          pOVar6 = p_00->aOp;
          iVar5 = p_00->nOp;
          pOVar6[(long)iVar5 + -1].p4type = -7;
          pOVar6[(long)iVar5 + -1].p4.pKeyInfo = (KeyInfo *)pFVar3;
        }
        else if ((pFVar3->funcFlags & 0x10) != 0) {
          sqlite3DbNNFreeNN(p_00->db,pFVar3);
        }
      }
      else {
        sqlite3VdbeAddOp3(p_00,0xa5,pWVar4->regAccum,iVar5,0);
        pFVar3 = pWVar4->pWFunc;
        if (p_00->db->mallocFailed == '\0') {
          pOVar6 = p_00->aOp;
          iVar5 = p_00->nOp;
          pOVar6[(long)iVar5 + -1].p4type = -7;
          pOVar6[(long)iVar5 + -1].p4.pKeyInfo = (KeyInfo *)pFVar3;
        }
        else if ((pFVar3->funcFlags & 0x10) != 0) {
          sqlite3DbNNFreeNN(p_00->db,pFVar3);
        }
        sqlite3VdbeAddOp3(p_00,0x50,pWVar4->regAccum,pWVar4->regResult,0);
        sqlite3VdbeAddOp3(p_00,0x4b,0,pWVar4->regAccum,0);
      }
    }
  }
  return;
}

Assistant:

static void windowAggFinal(WindowCodeArg *p, int bFin){
  Parse *pParse = p->pParse;
  Window *pMWin = p->pMWin;
  Vdbe *v = sqlite3GetVdbe(pParse);
  Window *pWin;

  for(pWin=pMWin; pWin; pWin=pWin->pNextWin){
    if( pMWin->regStartRowid==0
     && (pWin->pWFunc->funcFlags & SQLITE_FUNC_MINMAX)
     && (pWin->eStart!=TK_UNBOUNDED)
    ){
      sqlite3VdbeAddOp2(v, OP_Null, 0, pWin->regResult);
      sqlite3VdbeAddOp1(v, OP_Last, pWin->csrApp);
      VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_Column, pWin->csrApp, 0, pWin->regResult);
      sqlite3VdbeJumpHere(v, sqlite3VdbeCurrentAddr(v)-2);
    }else if( pWin->regApp ){
      assert( pMWin->regStartRowid==0 );
    }else{
      int nArg = windowArgCount(pWin);
      if( bFin ){
        sqlite3VdbeAddOp2(v, OP_AggFinal, pWin->regAccum, nArg);
        sqlite3VdbeAppendP4(v, pWin->pWFunc, P4_FUNCDEF);
        sqlite3VdbeAddOp2(v, OP_Copy, pWin->regAccum, pWin->regResult);
        sqlite3VdbeAddOp2(v, OP_Null, 0, pWin->regAccum);
      }else{
        sqlite3VdbeAddOp3(v, OP_AggValue,pWin->regAccum,nArg,pWin->regResult);
        sqlite3VdbeAppendP4(v, pWin->pWFunc, P4_FUNCDEF);
      }
    }
  }
}